

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScript.c
# Opt level: O3

Vec_Ptr_t * Gia_ManOrderPios(Aig_Man_t *p,Gia_Man_t *pOrder)

{
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  void *local_38;
  
  iVar8 = p->nObjs[2];
  if (iVar8 != pOrder->vCis->nSize) {
    __assert_fail("Aig_ManCiNum(p) == Gia_ManCiNum(pOrder)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaScript.c"
                  ,0xf3,"Vec_Ptr_t *Gia_ManOrderPios(Aig_Man_t *, Gia_Man_t *)");
  }
  iVar7 = p->nObjs[3];
  if (iVar7 != pOrder->vCos->nSize) {
    __assert_fail("Aig_ManCoNum(p) == Gia_ManCoNum(pOrder)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaScript.c"
                  ,0xf4,"Vec_Ptr_t *Gia_ManOrderPios(Aig_Man_t *, Gia_Man_t *)");
  }
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  uVar11 = 8;
  if (6 < (iVar7 + iVar8) - 1U) {
    uVar11 = (ulong)(uint)(iVar7 + iVar8);
  }
  pVVar4->nSize = 0;
  iVar8 = (int)uVar11;
  pVVar4->nCap = iVar8;
  if (iVar8 == 0) {
    ppvVar5 = (void **)0x0;
  }
  else {
    ppvVar5 = (void **)malloc((long)iVar8 << 3);
  }
  pVVar4->pArray = ppvVar5;
  if (0 < pOrder->nObjs) {
    lVar9 = 0;
    iVar8 = 0;
    lVar10 = 0;
    uVar12 = uVar11;
    do {
      if (pOrder->pObjs == (Gia_Obj_t *)0x0) {
        return pVVar4;
      }
      uVar1 = *(undefined8 *)(&pOrder->pObjs->field_0x0 + lVar9);
      uVar2 = (uint)uVar1;
      uVar3 = (uint)((ulong)uVar1 >> 0x20);
      if ((~uVar2 & 0x9fffffff) == 0) {
        if (p->vCis->nSize <= (int)(uVar3 & 0x1fffffff)) {
LAB_00715e8c:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        local_38 = *(void **)((long)p->vCis->pArray + (ulong)(uVar3 << 3));
        iVar7 = (int)uVar12;
        if (iVar8 == iVar7) {
          if (iVar7 < 0x10) {
LAB_00715dc2:
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
            }
            pVVar4->pArray = ppvVar5;
            pVVar4->nCap = 0x10;
            uVar12 = 0x10;
            uVar11 = 0x10;
          }
          else {
            uVar2 = iVar7 * 2;
            uVar12 = (ulong)uVar2;
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(uVar12 * 8);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar4->pArray,uVar12 * 8);
            }
            pVVar4->pArray = ppvVar5;
            pVVar4->nCap = uVar2;
            uVar11 = (ulong)uVar2;
          }
        }
        else {
          ppvVar5 = pVVar4->pArray;
          uVar11 = uVar12;
        }
LAB_00715e56:
        lVar6 = (long)iVar8;
        iVar8 = iVar8 + 1;
        pVVar4->nSize = iVar8;
        ppvVar5[lVar6] = local_38;
      }
      else if ((~uVar2 & 0x1fffffff) != 0 && (int)uVar2 < 0) {
        if (p->vCos->nSize <= (int)(uVar3 & 0x1fffffff)) goto LAB_00715e8c;
        local_38 = *(void **)((long)p->vCos->pArray + (ulong)(uVar3 << 3));
        iVar7 = (int)uVar11;
        if (iVar8 == iVar7) {
          if (iVar7 < 0x10) goto LAB_00715dc2;
          uVar2 = iVar7 * 2;
          uVar11 = (ulong)uVar2;
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(uVar11 * 8);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar4->pArray,uVar11 * 8);
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = uVar2;
          uVar12 = (ulong)uVar2;
        }
        else {
          ppvVar5 = pVVar4->pArray;
        }
        goto LAB_00715e56;
      }
      lVar10 = lVar10 + 1;
      lVar9 = lVar9 + 0xc;
    } while (lVar10 < pOrder->nObjs);
  }
  return pVVar4;
}

Assistant:

Vec_Ptr_t * Gia_ManOrderPios( Aig_Man_t * p, Gia_Man_t * pOrder )
{
    Vec_Ptr_t * vPios;
    Gia_Obj_t * pObj;
    int i;
    assert( Aig_ManCiNum(p) == Gia_ManCiNum(pOrder) );
    assert( Aig_ManCoNum(p) == Gia_ManCoNum(pOrder) );
    vPios = Vec_PtrAlloc( Aig_ManCiNum(p) + Aig_ManCoNum(p) );
    Gia_ManForEachObj( pOrder, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
            Vec_PtrPush( vPios, Aig_ManCi(p, Gia_ObjCioId(pObj)) );
        else if ( Gia_ObjIsCo(pObj) )
            Vec_PtrPush( vPios, Aig_ManCo(p, Gia_ObjCioId(pObj)) );
    }
    return vPios;
}